

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O2

LPVOID __thiscall
Memory::PreReservedVirtualAllocWrapper::AllocPages
          (PreReservedVirtualAllocWrapper *this,LPVOID lpAddress,size_t pageCount,
          DWORD allocationType,DWORD protectFlags,bool isCustomHeapAllocation)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint uVar4;
  BVIndex index;
  undefined4 *puVar5;
  LPVOID pvVar6;
  ulong uVar7;
  SIZE_T SVar8;
  ulong uVar9;
  LPCVOID lpAddress_00;
  ulong dwSize;
  double dVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 local_88 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  AutoCriticalSection autocs;
  
  if (pageCount >> 0x34 == 0) {
    if (!isCustomHeapAllocation) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x119,"(isCustomHeapAllocation)",
                         "PreReservation used for allocations other than CustomHeap?");
      if (!bVar2) goto LAB_006bfe1b;
      *puVar5 = 0;
    }
    if (pageCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x11b,"(dwSize != 0)","dwSize != 0");
      if (!bVar2) goto LAB_006bfe1b;
      *puVar5 = 0;
    }
    memBasicInfo._40_8_ = &this->cs;
    CCLock::Enter((CCLock *)memBasicInfo._40_8_);
    pvVar6 = EnsurePreReservedRegionInternal(this);
    if (pvVar6 == (LPVOID)0x0) {
      uVar4 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
      pvVar6 = (LPVOID)0x0;
      Output::Trace(PreReservedHeapAllocPhase,
                    L"No space to pre-reserve memory with %d pages. Returning NULL\n",
                    (ulong)(uVar4 << 0xc));
    }
    else {
      uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
      dwSize = pageCount * 0x1000;
      uVar9 = (ulong)uVar4;
      uVar7 = dwSize / uVar9;
      if (uVar7 >> 0x20 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x12a,"(requestedNumOfSegments <= ((uint32_t)~((uint32_t)0)))",
                           "requestedNumOfSegments <= MAXUINT32");
        if (!bVar2) goto LAB_006bfe1b;
        *puVar5 = 0;
      }
      if (lpAddress == (LPVOID)0x0) {
        if (dwSize < uVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x12e,"(requestedNumOfSegments != 0)","requestedNumOfSegments != 0");
          if (!bVar2) goto LAB_006bfe1b;
          *puVar5 = 0;
        }
        uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
        if (dwSize % (ulong)uVar4 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x12f,
                             "(dwSize % AutoSystemInfo::Data.GetAllocationGranularityPageSize() == 0)"
                             ,"dwSize should be aligned with Allocation Granularity");
          if (!bVar2) goto LAB_006bfe1b;
          *puVar5 = 0;
        }
        index = 0xffffffff;
        do {
          index = BVStatic<4096UL>::GetNextBit(&this->freeSegments,index + 1);
          if ((index == 0xffffffff) || (0x1000 - index < uVar7)) {
            pvVar6 = (LPVOID)0x0;
            Output::Trace(PreReservedHeapAllocPhase,
                          L"No more space to commit in PreReserved Memory region.\n");
            goto LAB_006bfe00;
          }
          BVar3 = BVStatic<4096UL>::TestRange(&this->freeSegments,index,(uint)uVar7);
        } while (BVar3 == '\0');
        uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
        lpAddress_00 = (LPCVOID)((ulong)(uVar4 * index) + (long)this->preReservedStartAddress);
        SVar8 = VirtualQuery(lpAddress_00,(PMEMORY_BASIC_INFORMATION)local_88,0x30);
        if (((SVar8 == 0) ||
            (uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data),
            (ulong)memBasicInfo._16_8_ < uVar7 * uVar4)) || ((int)memBasicInfo.RegionSize == 0x1000)
           ) {
          CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        }
      }
      else {
        if ((lpAddress < this->preReservedStartAddress) &&
           (pvVar6 = GetPreReservedEndAddress(this), pvVar6 <= (LPVOID)(dwSize + (long)lpAddress)))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x151,
                             "(((char*) lpAddress) >= (char*) preReservedStartAddress || ((char*) lpAddress + dwSize) < GetPreReservedEndAddress())"
                             ,
                             "((char*) lpAddress) >= (char*) preReservedStartAddress || ((char*) lpAddress + dwSize) < GetPreReservedEndAddress()"
                            );
          if (!bVar2) goto LAB_006bfe1b;
          *puVar5 = 0;
        }
        pvVar6 = this->preReservedStartAddress;
        uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
        index = (BVIndex)(((long)lpAddress - (long)pvVar6) / (long)(ulong)uVar4);
        uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
        auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)dwSize);
        auVar11._8_4_ = (int)(dwSize >> 0x20);
        auVar11._12_4_ = 0x45300000;
        dVar12 = auVar11._8_8_ - 1.9342813113834067e+25;
        auVar10._8_8_ = (auVar11._0_8_ - 4503599627370496.0) + dVar12;
        auVar10._0_8_ = ((auVar11._0_8_ - 4503599627370496.0) + dVar12) / (double)uVar4;
        auVar11 = roundsd(auVar10,auVar10,10);
        uVar4 = (uint)(long)auVar11._0_8_;
        if (uVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x157,"(numOfSegments != 0)","numOfSegments != 0");
          if (!bVar2) goto LAB_006bfe1b;
          *puVar5 = 0;
        }
        if (0xfff < (uVar4 + index) - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x158,
                             "(freeSegmentsBVIndex + numOfSegments - 1 < freeSegments.Length())",
                             "freeSegmentsBVIndex + numOfSegments - 1 < freeSegments.Length()");
          if (!bVar2) goto LAB_006bfe1b;
          *puVar5 = 0;
        }
        BVar3 = BVStatic<4096UL>::TestRange(&this->freeSegments,index,uVar4);
        lpAddress_00 = lpAddress;
        if (BVar3 != '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                             ,0x159,"(!freeSegments.TestRange(freeSegmentsBVIndex, numOfSegments))",
                             "!freeSegments.TestRange(freeSegmentsBVIndex, numOfSegments)");
          if (!bVar2) goto LAB_006bfe1b;
          *puVar5 = 0;
        }
      }
      if (0xfff < index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x15d,"(freeSegmentsBVIndex < PreReservedAllocationSegmentCount)",
                           "Invalid BitVector index calculation?");
        if (!bVar2) goto LAB_006bfe1b;
        *puVar5 = 0;
      }
      pvVar6 = lpAddress_00;
      if (((allocationType >> 0xc & 1) == 0) ||
         (pvVar6 = VirtualAlloc(lpAddress_00,dwSize,0x1000,protectFlags), pvVar6 != (LPVOID)0x0)) {
        if ((lpAddress == (LPVOID)0x0) && (pvVar6 != (LPVOID)0x0)) {
          if (pvVar6 != lpAddress_00) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                               ,0x193,"(allocatedAddress == addressToReserve)",
                               "allocatedAddress == addressToReserve");
            if (!bVar2) goto LAB_006bfe1b;
            *puVar5 = 0;
          }
          if (dwSize < uVar9) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                               ,0x194,"(requestedNumOfSegments != 0)","requestedNumOfSegments != 0")
            ;
            if (!bVar2) {
LAB_006bfe1b:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
          }
          BVStatic<4096UL>::ClearRange(&this->freeSegments,index,(uint)uVar7);
        }
      }
      else {
        pvVar6 = (LPVOID)0x0;
      }
      uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
      Output::Trace(PreReservedHeapAllocPhase,
                    L"MEM_COMMIT: StartAddress: 0x%p of size: 0x%x * 0x%x bytes \n",pvVar6,uVar7,
                    (ulong)uVar4);
    }
LAB_006bfe00:
    AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&memBasicInfo.Type);
  }
  else {
    pvVar6 = (LPVOID)0x0;
  }
  return pvVar6;
}

Assistant:

LPVOID PreReservedVirtualAllocWrapper::AllocPages(LPVOID lpAddress, size_t pageCount,  DWORD allocationType, DWORD protectFlags, bool isCustomHeapAllocation)
{
    if (pageCount > AutoSystemInfo::MaxPageCount)
    {
        return nullptr;
    }
    size_t dwSize = pageCount * AutoSystemInfo::PageSize;

    AssertMsg(isCustomHeapAllocation, "PreReservation used for allocations other than CustomHeap?");

    Assert(dwSize != 0);

    {
        AutoCriticalSection autocs(&this->cs);
        //Return nullptr, if no space to Reserve
        if (EnsurePreReservedRegionInternal() == nullptr)
        {
            PreReservedHeapTrace(_u("No space to pre-reserve memory with %d pages. Returning NULL\n"), PreReservedAllocationSegmentCount * AutoSystemInfo::Data.GetAllocationGranularityPageCount());
            return nullptr;
        }

        char * addressToReserve = nullptr;

        uint freeSegmentsBVIndex = BVInvalidIndex;
        size_t requestedNumOfSegments = dwSize / (AutoSystemInfo::Data.GetAllocationGranularityPageSize());
        Assert(requestedNumOfSegments <= MAXUINT32);

        if (lpAddress == nullptr)
        {
            Assert(requestedNumOfSegments != 0);
            AssertMsg(dwSize % AutoSystemInfo::Data.GetAllocationGranularityPageSize() == 0, "dwSize should be aligned with Allocation Granularity");

            do
            {
                freeSegmentsBVIndex = freeSegments.GetNextBit(freeSegmentsBVIndex + 1);
                //Return nullptr, if we don't have free/decommit pages to allocate
                if ((freeSegments.Length() - freeSegmentsBVIndex < requestedNumOfSegments) ||
                    freeSegmentsBVIndex == BVInvalidIndex)
                {
                    PreReservedHeapTrace(_u("No more space to commit in PreReserved Memory region.\n"));
                    return nullptr;
                }
            } while (!freeSegments.TestRange(freeSegmentsBVIndex, static_cast<uint>(requestedNumOfSegments)));

            uint offset = freeSegmentsBVIndex * AutoSystemInfo::Data.GetAllocationGranularityPageSize();
            addressToReserve = (char*) preReservedStartAddress + offset;

            //Check if the region is not already in MEM_COMMIT state.
            MEMORY_BASIC_INFORMATION memBasicInfo;
            size_t bytes = VirtualQuery(addressToReserve, &memBasicInfo, sizeof(memBasicInfo));
            if (bytes == 0)
            {
                MemoryOperationLastError::RecordLastError();
            }
            if (bytes == 0
                || memBasicInfo.RegionSize < requestedNumOfSegments * AutoSystemInfo::Data.GetAllocationGranularityPageSize()
                || memBasicInfo.State == MEM_COMMIT)
            {
                CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
            }
        }
        else
        {
            //Check If the lpAddress is within the range of the preReserved Memory Region
            Assert(((char*) lpAddress) >= (char*) preReservedStartAddress || ((char*) lpAddress + dwSize) < GetPreReservedEndAddress());

            addressToReserve = (char*) lpAddress;
            freeSegmentsBVIndex = (uint) ((addressToReserve - (char*) preReservedStartAddress) / AutoSystemInfo::Data.GetAllocationGranularityPageSize());
#if DBG
            uint numOfSegments = (uint)ceil((double)dwSize / (double)AutoSystemInfo::Data.GetAllocationGranularityPageSize());
            Assert(numOfSegments != 0);
            Assert(freeSegmentsBVIndex + numOfSegments - 1 < freeSegments.Length());
            Assert(!freeSegments.TestRange(freeSegmentsBVIndex, numOfSegments));
#endif
        }

        AssertMsg(freeSegmentsBVIndex < PreReservedAllocationSegmentCount, "Invalid BitVector index calculation?");
        AssertMsg(dwSize % AutoSystemInfo::PageSize == 0, "COMMIT is managed at AutoSystemInfo::PageSize granularity");

        char * allocatedAddress = nullptr;
        bool failedToProtectPages = false;

        if ((allocationType & MEM_COMMIT) != 0)
        {
#if defined(ENABLE_JIT_CLAMP)
            AutoEnableDynamicCodeGen enableCodeGen;
#endif

#if defined(_CONTROL_FLOW_GUARD)
            if (GlobalSecurityPolicy::IsCFGEnabled())
            {
                DWORD oldProtect = 0;
                DWORD allocProtectFlags = 0;

                allocProtectFlags = PAGE_EXECUTE_RW_TARGETS_INVALID;

                allocatedAddress = (char *)VirtualAlloc(addressToReserve, dwSize, MEM_COMMIT, allocProtectFlags);
                if (allocatedAddress != nullptr)
                {
                    BOOL result = VirtualProtect(allocatedAddress, dwSize, protectFlags, &oldProtect);
                    if (result == FALSE)
                    {
                        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
                    }
                    AssertMsg(oldProtect == (PAGE_EXECUTE_READWRITE), "CFG Bitmap gets allocated and bits will be set to invalid only upon passing these flags.");
                }
                else
                {
                    MemoryOperationLastError::RecordLastError();
                }
            }
            else
#endif
            {
                allocatedAddress = (char *)VirtualAlloc(addressToReserve, dwSize, MEM_COMMIT, protectFlags);
                if (allocatedAddress == nullptr)
                {
                    MemoryOperationLastError::RecordLastError();
                }
            }
        }
        else
        {
            // Just return the uncommitted address if we didn't ask to commit it.
            allocatedAddress = addressToReserve;
        }

        // Keep track of the committed pages within the preReserved Memory Region
        if (lpAddress == nullptr && allocatedAddress != nullptr)
        {
            Assert(allocatedAddress == addressToReserve);
            Assert(requestedNumOfSegments != 0);
            freeSegments.ClearRange(freeSegmentsBVIndex, static_cast<uint>(requestedNumOfSegments));
        }

        PreReservedHeapTrace(_u("MEM_COMMIT: StartAddress: 0x%p of size: 0x%x * 0x%x bytes \n"), allocatedAddress, requestedNumOfSegments, AutoSystemInfo::Data.GetAllocationGranularityPageSize());
        if (failedToProtectPages)
        {
            return nullptr;
        }
        return allocatedAddress;
    }
}